

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O1

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::existsCompatibleMatch
          (ClauseMatcher *this,ILStruct *si,MatchInfo *sq,ILStruct *targets)

{
  ulong uVar1;
  bool bVar2;
  MatchInfo **ppMVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar5 = (ulong)targets->matchCnt;
  bVar6 = uVar5 != 0;
  if (bVar6) {
    ppMVar3 = CodeTree::ILStruct::getMatch(targets,0);
    bVar2 = compatible(this,si,sq,targets,*ppMVar3);
    if (!bVar2) {
      uVar1 = 1;
      do {
        uVar4 = uVar1;
        if (uVar5 == uVar4) break;
        ppMVar3 = CodeTree::ILStruct::getMatch(targets,(uint)uVar4);
        bVar6 = compatible(this,si,sq,targets,*ppMVar3);
        uVar1 = uVar4 + 1;
      } while (!bVar6);
      bVar6 = uVar4 < uVar5;
    }
  }
  return bVar6;
}

Assistant:

bool ClauseCodeTree::ClauseMatcher::existsCompatibleMatch(ILStruct* si, MatchInfo* sq, ILStruct* targets)
{
  size_t tcnt=targets->matchCnt;
  for(size_t i=0;i<tcnt;i++) {
    if(compatible(si,sq,targets,targets->getMatch(i))) {
      return true;
    }
  }
  return false;
}